

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

TimeZone * icu_63::TimeZone::createCustomTimeZone(UnicodeString *id)

{
  UBool UVar1;
  SimpleTimeZone *this;
  size_t size;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t sign;
  UnicodeString customID;
  int local_78;
  uint local_74;
  int32_t local_70;
  int local_6c;
  UnicodeString local_68;
  
  UVar1 = parseCustomID(id,&local_6c,&local_70,(int32_t *)&local_74,&local_78);
  if (UVar1 == '\0') {
    this = (SimpleTimeZone *)0x0;
  }
  else {
    local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
    local_68.fUnion.fStackFields.fLengthAndFlags = 2;
    size = (size_t)local_74;
    formatCustomID(local_70,local_74,local_78,(byte)((uint)local_6c >> 0x1f),&local_68);
    this = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,size);
    if (this == (SimpleTimeZone *)0x0) {
      this = (SimpleTimeZone *)0x0;
    }
    else {
      SimpleTimeZone::SimpleTimeZone
                (this,local_6c * ((local_70 * 0x3c + local_74) * 0x3c + local_78) * 1000,&local_68);
    }
    UnicodeString::~UnicodeString(&local_68);
  }
  return (TimeZone *)this;
}

Assistant:

TimeZone*
TimeZone::createCustomTimeZone(const UnicodeString& id)
{
    int32_t sign, hour, min, sec;
    if (parseCustomID(id, sign, hour, min, sec)) {
        UnicodeString customID;
        formatCustomID(hour, min, sec, (sign < 0), customID);
        int32_t offset = sign * ((hour * 60 + min) * 60 + sec) * 1000;
        return new SimpleTimeZone(offset, customID);
    }
    return NULL;
}